

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

int __thiscall QTextDocumentPrivate::undoRedo(QTextDocumentPrivate *this,bool undo)

{
  byte bVar1;
  uint uVar2;
  qsizetype qVar3;
  reference pQVar4;
  QTextFragmentData *pQVar5;
  QTextBlockData *pQVar6;
  QTextDocumentPrivate *pQVar7;
  const_reference pQVar8;
  int *piVar9;
  byte in_SIL;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int newCursorPos;
  bool inBlock;
  QTextBlockData *B;
  int b;
  int oldFormat_2;
  QTextObject *object;
  QTextBlockGroup *group;
  QTextBlockGroup *oldGroup;
  int oldFormat_1;
  int oldFormat;
  int resetBlockRevision;
  QTextUndoCommand *c;
  int editLength;
  int editPos;
  QTextBlock it_1;
  FragmentIterator it;
  uint in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined1 available;
  QTextDocumentPrivate *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QTextDocumentPrivate *in_stack_ffffffffffffff08;
  Operation in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  long in_stack_ffffffffffffff28;
  int local_c8;
  QTextBlockData *in_stack_ffffffffffffff40;
  Operation op;
  uint in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QTextObject *in_stack_ffffffffffffff50;
  int iVar10;
  QTextDocumentPrivate *in_stack_ffffffffffffff58;
  quint32 local_8c;
  int local_7c;
  quint32 local_78;
  QTextDocumentPrivate *pQVar11;
  int local_64;
  int local_60;
  int local_5c [9];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  if (((in_RDI->undoEnabled & 1U) == 0) || ((bVar1 != 0 && (in_RDI->undoState == 0)))) {
LAB_007d4b32:
    local_64 = -1;
  }
  else {
    pQVar11 = in_RDI;
    if (bVar1 == 0) {
      in_stack_ffffffffffffff28 = (long)in_RDI->undoState;
      qVar3 = QList<QTextUndoCommand>::size(&in_RDI->undoStack);
      if (in_stack_ffffffffffffff28 == qVar3) goto LAB_007d4b32;
    }
    in_RDI->undoEnabled = false;
    beginEditBlock(in_RDI);
    local_78 = 0xffffffff;
    local_7c = -1;
    do {
      if (bVar1 != 0) {
        in_RDI->undoState = in_RDI->undoState + -1;
      }
      pQVar4 = QList<QTextUndoCommand>::operator[]
                         ((QList<QTextUndoCommand> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      local_8c = pQVar4->pos;
      uVar2 = (uint)pQVar4->command;
      if (uVar2 == 0) {
        remove(in_RDI,(char *)(ulong)pQVar4->pos);
        pQVar4->command = 1;
        local_78 = pQVar4->pos;
        local_7c = 0;
      }
      else if (uVar2 == 1) {
        insert_string(in_RDI,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                      (uint)in_stack_ffffffffffffff28,1,in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff1c);
        pQVar4->command = 0;
        if (local_78 != pQVar4->pos) {
          local_7c = 0;
        }
        local_78 = pQVar4->pos;
        local_7c = (pQVar4->field_8).blockFormat + local_7c;
      }
      else if (uVar2 == 2) {
        local_8c = 0xffffffff;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        find((QTextDocumentPrivate *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee4);
        pQVar5 = QFragmentMap<QTextFragmentData>::ConstIterator::value((ConstIterator *)0x7d4f2d);
        iVar10 = pQVar5->format;
        in_stack_ffffffffffffff1c = pQVar4->pos;
        in_stack_ffffffffffffff20 = (pQVar4->field_8).blockFormat;
        QTextFormatCollection::charFormat
                  ((QTextFormatCollection *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        setCharFormat(in_RDI,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                      (int)in_stack_ffffffffffffff28,
                      (QTextCharFormat *)CONCAT44(uVar2,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d4fa6);
        pQVar4->format = iVar10;
        if (local_78 != pQVar4->pos) {
          local_7c = 0;
        }
        local_78 = pQVar4->pos;
        local_7c = (pQVar4->field_8).blockFormat + local_7c;
      }
      else if (uVar2 == 3) {
        local_8c = 0xffffffff;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        blocksFind((QTextDocumentPrivate *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
        pQVar6 = block((QTextBlock *)0x7d505a);
        iVar10 = pQVar6->format;
        in_stack_ffffffffffffff04 = pQVar4->format;
        pQVar6 = block((QTextBlock *)0x7d5080);
        pQVar6->format = in_stack_ffffffffffffff04;
        QTextFormatCollection::blockFormat
                  ((QTextFormatCollection *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        objectForFormat((QTextDocumentPrivate *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (QTextFormat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                       );
        pQVar7 = (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d50c1);
        QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7d50d3);
        in_stack_ffffffffffffff08 = pQVar7;
        QTextFormatCollection::blockFormat
                  ((QTextFormatCollection *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        objectForFormat((QTextDocumentPrivate *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (QTextFormat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                       );
        in_stack_ffffffffffffff58 =
             (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d511e);
        QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7d5130);
        pQVar4->format = iVar10;
        if (in_stack_ffffffffffffff58 == pQVar7) {
          if (in_stack_ffffffffffffff58 != (QTextDocumentPrivate *)0x0) {
            (**(code **)(*(long *)in_stack_ffffffffffffff58 + 0x70))
                      (in_stack_ffffffffffffff58,&local_38);
          }
        }
        else {
          if (pQVar7 != (QTextDocumentPrivate *)0x0) {
            (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,&local_38);
          }
          if (in_stack_ffffffffffffff58 != (QTextDocumentPrivate *)0x0) {
            (**(code **)(*(long *)in_stack_ffffffffffffff58 + 0x60))
                      (in_stack_ffffffffffffff58,&local_38);
          }
        }
        in_stack_ffffffffffffff00 =
             QTextBlock::position
                       ((QTextBlock *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        QTextBlock::length((QTextBlock *)
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        documentChange(in_stack_fffffffffffffef0,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                       in_stack_fffffffffffffeec);
        local_78 = 0xffffffff;
      }
      else {
        op = (Operation)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        iVar10 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        if (uVar2 == 4) {
LAB_007d4d7d:
          remove_block(in_stack_ffffffffffffff58,iVar10,
                       (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),op,
                       (Operation)in_stack_ffffffffffffff40);
          if (pQVar4->command == 4) {
            pQVar4->command = 5;
          }
          else {
            pQVar4->command = 7;
          }
          local_78 = pQVar4->pos;
          local_7c = 0;
        }
        else {
          if (uVar2 != 5) {
            if (uVar2 == 6) goto LAB_007d4d7d;
            if (uVar2 != 7) {
              if (uVar2 == 8) {
                local_8c = 0xffffffff;
                in_stack_ffffffffffffff50 =
                     objectForIndex(in_stack_fffffffffffffef0,
                                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
                in_stack_ffffffffffffff4c =
                     QTextFormatCollection::objectFormatIndex
                               ((QTextFormatCollection *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                in_stack_fffffffffffffee4);
                changeObjectFormat(in_stack_ffffffffffffff08,
                                   (QTextObject *)
                                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                   in_stack_fffffffffffffefc);
                pQVar4->format = in_stack_ffffffffffffff4c;
                local_78 = 0xffffffff;
              }
              else if (uVar2 == 9) {
                local_78 = pQVar4->pos;
                local_7c = 0;
              }
              else if (uVar2 == 0x100) {
                local_8c = 0xffffffff;
                if (bVar1 == 0) {
                  (*((pQVar4->field_8).custom)->_vptr_QAbstractUndoItem[3])();
                }
                else {
                  (*((pQVar4->field_8).custom)->_vptr_QAbstractUndoItem[2])();
                }
                local_78 = 0xffffffff;
              }
              goto LAB_007d52ea;
            }
          }
          in_stack_fffffffffffffed8 = (uint)pQVar4->command;
          insert_block(in_stack_ffffffffffffff58,iVar10,(uint)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,op,(int)pQVar11);
          local_8c = local_8c + 1;
          if (pQVar4->command == 5) {
            pQVar4->command = 4;
          }
          else {
            pQVar4->command = 6;
          }
          if (local_78 != pQVar4->pos) {
            local_7c = 0;
          }
          local_78 = pQVar4->pos;
          local_7c = local_7c + 1;
        }
      }
LAB_007d52ea:
      if (-1 < (int)local_8c) {
        in_stack_ffffffffffffff48 =
             QFragmentMap<QTextBlockData>::findNode
                       ((QFragmentMap<QTextBlockData> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
        in_stack_ffffffffffffff40 =
             QFragmentMap<QTextBlockData>::fragment
                       ((QFragmentMap<QTextBlockData> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
        *(uint *)&in_stack_ffffffffffffff40->field_0x44 =
             *(uint *)&in_stack_ffffffffffffff40->field_0x44 & 0x80000000 |
             pQVar4->revision & 0x7fffffff;
      }
      if (bVar1 == 0) {
        in_RDI->undoState = in_RDI->undoState + 1;
      }
      in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
      if (0 < in_RDI->undoState) {
        in_stack_fffffffffffffef0 = (QTextDocumentPrivate *)(long)in_RDI->undoState;
        qVar3 = QList<QTextUndoCommand>::size(&in_RDI->undoStack);
        in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
        if ((long)in_stack_fffffffffffffef0 < qVar3) {
          pQVar8 = QList<QTextUndoCommand>::at
                             ((QList<QTextUndoCommand> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
          if ((pQVar8->field_0x2 & 1) != 0) {
            pQVar8 = QList<QTextUndoCommand>::at
                               ((QList<QTextUndoCommand> *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
            in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
            if ((pQVar8->field_0x2 & 1) != 0) {
              pQVar8 = QList<QTextUndoCommand>::at
                                 ((QList<QTextUndoCommand> *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
              in_stack_fffffffffffffefc =
                   CONCAT13(((byte)pQVar8->field_0x2 >> 1 & 1) != 0,(int3)in_stack_fffffffffffffefc)
                   ^ 0xff000000;
            }
          }
        }
      }
    } while ((in_stack_fffffffffffffefc & 0x1000000) != 0);
    in_RDI->undoEnabled = true;
    local_c8 = -1;
    if ((int)local_78 < 0) {
      if (-1 < in_RDI->docChangeFrom) {
        local_5c[0] = in_RDI->docChangeFrom + in_RDI->docChangeLength;
        local_60 = length((QTextDocumentPrivate *)0x7d54c6);
        local_60 = local_60 + -1;
        piVar9 = qMin<int>(local_5c,&local_60);
        local_c8 = *piVar9;
      }
    }
    else {
      local_c8 = local_78 + local_7c;
    }
    available = (undefined1)((uint)in_stack_fffffffffffffeec >> 0x18);
    endEditBlock((QTextDocumentPrivate *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    isUndoAvailable(in_RDI);
    emitUndoAvailable(in_stack_fffffffffffffef0,(bool)available);
    isRedoAvailable(in_stack_fffffffffffffef0);
    emitRedoAvailable(in_stack_fffffffffffffef0,(bool)available);
    local_64 = local_c8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_64;
}

Assistant:

int QTextDocumentPrivate::undoRedo(bool undo)
{
    PMDEBUG("%s, undoState=%d, undoStack size=%d", undo ? "undo:" : "redo:", undoState, int(undoStack.size()));
    if (!undoEnabled || (undo && undoState == 0) || (!undo && undoState == undoStack.size()))
        return -1;

    undoEnabled = false;
    beginEditBlock();
    int editPos = -1;
    int editLength = -1;
    while (1) {
        if (undo)
            --undoState;
        QTextUndoCommand &c = undoStack[undoState];
        int resetBlockRevision = c.pos;

        switch (c.command) {
        case QTextUndoCommand::Inserted:
            remove(c.pos, c.length, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   erase: from %d, length %d", c.pos, c.length);
            c.command = QTextUndoCommand::Removed;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Removed:
            PMDEBUG("   insert: format %d (from %d, length %d, strpos=%d)", c.format, c.pos, c.length, c.strPos);
            insert_string(c.pos, c.strPos, c.length, c.format, (QTextUndoCommand::Operation)c.operation);
            c.command = QTextUndoCommand::Inserted;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        case QTextUndoCommand::BlockInserted:
        case QTextUndoCommand::BlockAdded:
            remove_block(c.pos, &c.blockFormat, c.command, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   blockremove: from %d", c.pos);
            if (c.command == QTextUndoCommand::BlockInserted)
                c.command = QTextUndoCommand::BlockRemoved;
            else
                c.command = QTextUndoCommand::BlockDeleted;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::BlockRemoved:
        case QTextUndoCommand::BlockDeleted:
            PMDEBUG("   blockinsert: charformat %d blockformat %d (pos %d, strpos=%d)", c.format, c.blockFormat, c.pos, c.strPos);
            insert_block(c.pos, c.strPos, c.format, c.blockFormat, (QTextUndoCommand::Operation)c.operation, c.command);
            resetBlockRevision += 1;
            if (c.command == QTextUndoCommand::BlockRemoved)
                c.command = QTextUndoCommand::BlockInserted;
            else
                c.command = QTextUndoCommand::BlockAdded;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += 1;
            break;
        case QTextUndoCommand::CharFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   charFormat: format %d (from %d, length %d)", c.format, c.pos, c.length);
            FragmentIterator it = find(c.pos);
            Q_ASSERT(!it.atEnd());

            int oldFormat = it.value()->format;
            setCharFormat(c.pos, c.length, formats.charFormat(c.format));
            c.format = oldFormat;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        }
        case QTextUndoCommand::BlockFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   blockformat: format %d pos %d", c.format, c.pos);
            QTextBlock it = blocksFind(c.pos);
            Q_ASSERT(it.isValid());

            int oldFormat = block(it)->format;
            block(it)->format = c.format;
            QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(oldFormat)));
            QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(c.format)));
            c.format = oldFormat;
            if (group != oldGroup) {
                if (oldGroup)
                    oldGroup->blockRemoved(it);
                if (group)
                    group->blockInserted(it);
            } else if (group) {
                group->blockFormatChanged(it);
            }
            documentChange(it.position(), it.length());
            editPos = -1;
            break;
        }
        case QTextUndoCommand::GroupFormatChange: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   group format change");
            QTextObject *object = objectForIndex(c.objectIndex);
            int oldFormat = formats.objectFormatIndex(c.objectIndex);
            changeObjectFormat(object, c.format);
            c.format = oldFormat;
            editPos = -1;
            break;
        }
        case QTextUndoCommand::CursorMoved:
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Custom:
            resetBlockRevision = -1; // ## TODO
            if (undo)
                c.custom->undo();
            else
                c.custom->redo();
            editPos = -1;
            break;
        default:
            Q_ASSERT(false);
        }

        if (resetBlockRevision >= 0) {
            int b = blocks.findNode(resetBlockRevision);
            QTextBlockData *B = blocks.fragment(b);
            B->revision = c.revision;
        }

        if (!undo)
            ++undoState;

        bool inBlock = (
                undoState > 0
                && undoState < undoStack.size()
                && undoStack.at(undoState).block_part
                && undoStack.at(undoState - 1).block_part
                && !undoStack.at(undoState - 1).block_end
                );
        if (!inBlock)
            break;
    }
    undoEnabled = true;

    int newCursorPos = -1;

    if (editPos >=0)
        newCursorPos = editPos + editLength;
    else if (docChangeFrom >= 0)
        newCursorPos= qMin(docChangeFrom + docChangeLength, length() - 1);

    endEditBlock();
    emitUndoAvailable(isUndoAvailable());
    emitRedoAvailable(isRedoAvailable());

    return newCursorPos;
}